

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_MD5.cc
# Opt level: O3

string * __thiscall Pl_MD5::getHexDigest_abi_cxx11_(string *__return_storage_ptr__,Pl_MD5 *this)

{
  logic_error *this_00;
  
  if (this->enabled != false) {
    this->in_progress = false;
    MD5::unparse_abi_cxx11_(__return_storage_ptr__,&this->md5);
    return __return_storage_ptr__;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"digest requested for a disabled MD5 Pipeline");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

std::string
Pl_MD5::getHexDigest()
{
    if (!this->enabled) {
        throw std::logic_error("digest requested for a disabled MD5 Pipeline");
    }
    this->in_progress = false;
    return this->md5.unparse();
}